

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createSLen(IRBuilder *this,Value *value,string *name)

{
  long lVar1;
  UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *pUVar2;
  Value *local_40;
  string local_38;
  
  local_40 = value;
  if (value != (Value *)0x0) {
    lVar1 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    if (lVar1 != 0) {
      std::__cxx11::string::string((string *)&local_38,(string *)(lVar1 + 0x48));
      pUVar2 = (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *)
               get(this,local_38._M_string_length);
      goto LAB_001389ae;
    }
  }
  makeName(&local_38,this,name);
  pUVar2 = insert<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                     (this,&local_40,&local_38);
LAB_001389ae:
  std::__cxx11::string::~string((string *)&local_38);
  return (Value *)pUVar2;
}

Assistant:

Value* IRBuilder::createSLen(Value* value, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(value))
    return get(a->get().size());

  return insert<SLenInstr>(value, makeName(name));
}